

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgcprll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
            int writemode,double *scale,double *zero,char *tform,long *twidth,int *tcode,
            int *maxelem,LONGLONG *startpos,LONGLONG *elemnum,long *incre,LONGLONG *repeat,
            LONGLONG *rowlen,int *hdutype,LONGLONG *tnull,char *snull,int *status)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int *status_00;
  long lVar5;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  int *in_RDI;
  long in_R8;
  int in_R9D;
  bool bVar6;
  int *unaff_retaddr;
  fitsfile *in_stack_00000008;
  undefined8 *in_stack_00000010;
  char *in_stack_00000018;
  long *in_stack_00000020;
  tcolumn *colptr;
  char message [81];
  LONGLONG tbcol;
  LONGLONG nrows;
  LONGLONG endrow;
  LONGLONG lrepeat;
  LONGLONG heapoffset;
  long nblock;
  LONGLONG endpos;
  LONGLONG datastart;
  int tstatus;
  int rangecheck;
  int nulpos;
  int *in_stack_00001620;
  int in_stack_0000162c;
  long in_stack_00001630;
  fitsfile *in_stack_00001638;
  int *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  long local_f0;
  LONGLONG *in_stack_ffffffffffffff28;
  LONGLONG *in_stack_ffffffffffffff30;
  LONGLONG in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  fitsfile *in_stack_ffffffffffffff48;
  LONGLONG in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  fitsfile *in_stack_ffffffffffffff78;
  long local_68;
  long local_60;
  int local_34;
  int local_4;
  
  if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
      iVar4 = ffrdef(in_stack_00000008,unaff_retaddr);
      if (0 < iVar4) {
        return *(int *)message._72_8_;
      }
    }
    else if ((0 < in_R9D) && (in_R9D != 0xf)) {
      if ((STREAM_DRIVER < 1) || (0x28 < STREAM_DRIVER)) {
        urltype2driver(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      }
      if (*(int *)(*(long *)(in_RDI + 2) + 4) == STREAM_DRIVER) {
        if (*(long *)(*(long *)(in_RDI + 2) + 0x88) + -0xb40 <
            *(long *)(*(long *)(in_RDI + 2) + 0x70)) {
          local_f0 = *(long *)(*(long *)(in_RDI + 2) + 0x70);
        }
        else {
          local_f0 = *(long *)(*(long *)(in_RDI + 2) + 0x88) + -0xb40;
        }
        if (*(long *)(*(long *)(in_RDI + 2) + 0x78) != local_f0) {
          ffwend((fitsfile *)message._8_8_,(int *)message._0_8_);
        }
      }
    }
  }
  else {
    ffmahd(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
           in_stack_ffffffffffffff60);
  }
  if (in_RDX < 1) {
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      snprintf(&stack0xffffffffffffff28,0x51,"Image group number is less than 1: %.0f",
               (double)in_RDX);
      ffpmsg((char *)0x1762e3);
      *(undefined4 *)message._72_8_ = 0x133;
      local_4 = 0x133;
    }
    else {
      snprintf(&stack0xffffffffffffff28,0x51,"Starting row number is less than 1: %.0f",
               (double)in_RDX);
      ffpmsg((char *)0x17632d);
      *(undefined4 *)message._72_8_ = 0x133;
      local_4 = 0x133;
    }
  }
  else if ((*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) || (0 < in_RCX)) {
    if (in_R8 < 0) {
      snprintf(&stack0xffffffffffffff28,0x51,"Tried to read or write less than 0 elements: %.0f",
               (double)in_R8);
      ffpmsg((char *)0x1763e7);
      *(undefined4 *)message._72_8_ = 0x132;
      local_4 = 0x132;
    }
    else if (((int)in_ESI < 1) || (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (int)in_ESI)) {
      snprintf(&stack0xffffffffffffff28,0x51,"Specified column number is out of range: %d",
               (ulong)in_ESI);
      ffpmsg((char *)0x176453);
      snprintf(&stack0xffffffffffffff28,0x51,"  There are %d columns in this table.",
               (ulong)*(uint *)(*(long *)(in_RDI + 2) + 0x3b0));
      ffpmsg((char *)0x176487);
      *(undefined4 *)message._72_8_ = 0x12e;
      local_4 = 0x12e;
    }
    else {
      *(undefined4 *)message._48_8_ = *(undefined4 *)(*(long *)(in_RDI + 2) + 0x58);
      *(undefined8 *)message._40_8_ = *(undefined8 *)(*(long *)(in_RDI + 2) + 0x3c8);
      lVar5 = *(long *)(*(long *)(in_RDI + 2) + 0x88);
      status_00 = (int *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(int)(in_ESI - 1) * 0xa0)
      ;
      iVar4 = status_00[0x19];
      in_stack_00000008->HDUposition = status_00[0x18];
      *(int *)&in_stack_00000008->field_0x4 = iVar4;
      *in_stack_00000010 = *(undefined8 *)(status_00 + 0x1a);
      *(undefined8 *)message._56_8_ = *(undefined8 *)(status_00 + 0x1c);
      lVar1 = *(long *)(status_00 + 0x12);
      *in_stack_00000020 = *(long *)(status_00 + 0x26);
      *(undefined8 *)message._24_8_ = *(undefined8 *)(status_00 + 0x26);
      *(int *)colptr->ttype = status_00[0x14];
      *(undefined8 *)message._32_8_ = *(undefined8 *)(status_00 + 0x16);
      strcpy(in_stack_00000018,(char *)(status_00 + 0x23));
      strcpy((char *)message._64_8_,(char *)(status_00 + 0x1e));
      if ((*(int *)message._48_8_ == 1) && (*(char *)message._64_8_ == '\0')) {
        strcpy((char *)message._64_8_,"                 ");
        if (*in_stack_00000020 < 0x12) {
          iVar4 = (int)*in_stack_00000020;
        }
        else {
          iVar4 = 0x11;
        }
        *(undefined1 *)(message._64_8_ + (long)iVar4) = 0;
      }
      local_34 = in_R9D;
      if ((0xe < in_R9D) && (in_R9D < 0x13)) {
        iVar4 = *(int *)colptr->ttype;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if ((iVar4 == 0x10) && (*(int *)message._48_8_ != 1)) {
          *(undefined8 *)message._24_8_ = 1;
          if (*(int *)colptr->ttype < 0) {
            *(long *)message._32_8_ = *in_stack_00000020;
          }
          *in_stack_00000020 = 1;
          *(undefined8 *)in_stack_00000008 = 0x3ff0000000000000;
          *in_stack_00000010 = 0;
          *(undefined8 *)message._56_8_ = 0x4995cdd1;
          *(undefined4 *)message._0_8_ = 0x7080;
          if (*(int *)colptr->ttype < 0) {
            colptr->ttype[0] = -0xb;
            colptr->ttype[1] = -1;
            colptr->ttype[2] = -1;
            colptr->ttype[3] = -1;
          }
          else {
            colptr->ttype[0] = '\v';
            colptr->ttype[1] = '\0';
            colptr->ttype[2] = '\0';
            colptr->ttype[3] = '\0';
          }
        }
        local_34 = in_R9D + -0x10;
      }
      bVar6 = local_34 == -1;
      if (bVar6) {
        local_34 = 0;
      }
      iVar4 = *(int *)colptr->ttype;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (iVar4 == 1) {
        *(int *)colptr->ttype = (*(int *)colptr->ttype / 1) * 0xb;
        *(long *)message._32_8_ = (*(long *)message._32_8_ + 7) / 8;
      }
      if ((*(int *)message._48_8_ == 2) && (*(int *)colptr->ttype == 0x10)) {
        if (*in_stack_00000020 == 0) {
          *(undefined8 *)message._32_8_ = 0;
        }
        else {
          *(long *)message._32_8_ = *(long *)message._32_8_ / *in_stack_00000020;
        }
      }
      else if ((*(int *)message._48_8_ == 2) && (*(int *)colptr->ttype == -0x10)) {
        *(undefined8 *)message._24_8_ = 1;
        *in_stack_00000020 = in_R8;
      }
      if (*(int *)message._48_8_ == 1) {
        *(undefined8 *)message._16_8_ = 0;
      }
      else {
        *(long *)message._16_8_ = in_RCX + -1;
      }
      iVar4 = *(int *)colptr->ttype;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (0x52 < iVar4) {
        if (*(int *)colptr->ttype < 1) {
          *(int *)colptr->ttype = (*(int *)colptr->ttype + -1) / 2;
        }
        else {
          *(int *)colptr->ttype = (*(int *)colptr->ttype + 1) / 2;
        }
        *(long *)message._32_8_ = *(long *)message._32_8_ << 1;
        *in_stack_00000020 = *in_stack_00000020 / 2;
        *(long *)message._24_8_ = *(long *)message._24_8_ / 2;
      }
      iVar4 = *(int *)colptr->ttype;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (iVar4 == 0x2a) {
        *(undefined4 *)message._0_8_ = 0x1c20;
      }
      else {
        iVar4 = *(int *)colptr->ttype;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (iVar4 == 0x52) {
          *(undefined4 *)message._0_8_ = 0xe10;
        }
        else {
          iVar4 = *(int *)colptr->ttype;
          if (iVar4 < 1) {
            iVar4 = -iVar4;
          }
          if (iVar4 == 0x10) {
            if (*in_stack_00000020 == 0) {
              *(undefined4 *)message._0_8_ = 0x707f;
            }
            else {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = SUB168(SEXT816(0x707f),8);
              *(int *)message._0_8_ =
                   SUB164((auVar2 << 0x40 | ZEXT816(0x707f)) / SEXT816(*in_stack_00000020),0);
            }
            if (*(int *)message._0_8_ == 0) {
              snprintf(&stack0xffffffffffffff28,0x51,
                       "ASCII string column is too wide: %ld; max supported width is %d",
                       *in_stack_00000020,0x707f);
              ffpmsg((char *)0x176a91);
              *(undefined4 *)message._72_8_ = 0xec;
              return 0xec;
            }
          }
          else {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = SUB168(SEXT816(0x7080),8);
            *(int *)message._0_8_ =
                 SUB164((auVar3 << 0x40 | ZEXT816(0x7080)) / SEXT816(*in_stack_00000020),0);
          }
        }
      }
      *(long *)message._8_8_ = lVar5 + (in_RDX + -1) * *(long *)message._40_8_ + lVar1;
      if ((*(int *)message._48_8_ == 0) && (local_34 != 0)) {
        if (*(long *)message._32_8_ < *(long *)message._16_8_ + in_R8) {
          *(long *)message._32_8_ = *(long *)message._16_8_ + in_R8;
        }
      }
      else if (*(int *)colptr->ttype < 1) {
        *(int *)colptr->ttype = -*(int *)colptr->ttype;
        if (local_34 == 0) {
          if (*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < in_RDX) {
            ffpmsg((char *)0x177508);
            snprintf(&stack0xffffffffffffff28,0x51,
                     "  Table has %.0f rows and tried to read row %.0f.",
                     (double)*(long *)(*(long *)(in_RDI + 2) + 0x3c0),(double)in_RDX);
            ffpmsg((char *)0x177549);
            *(undefined4 *)message._72_8_ = 0x133;
            return 0x133;
          }
          ffgdesll(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,status_00);
          *(long *)message._32_8_ = local_68;
          if (status_00[0x14] < -0x52) {
            *(long *)message._32_8_ = *(long *)message._32_8_ << 1;
          }
          else if (status_00[0x14] == -1) {
            *(long *)message._32_8_ = (*(long *)message._32_8_ + 7) / 8;
          }
          if (*(long *)message._32_8_ <= *(long *)message._16_8_) {
            snprintf(&stack0xffffffffffffff28,0x51,
                     "Starting element to read in variable length column is too large: %ld",in_RCX);
            ffpmsg((char *)0x17764a);
            snprintf(&stack0xffffffffffffff28,0x51,"  This row only contains %ld elements",
                     *(undefined8 *)message._32_8_);
            ffpmsg((char *)0x177677);
            *(undefined4 *)message._72_8_ = 0x134;
            return 0x134;
          }
          *(long *)message._8_8_ = lVar5 + local_60 + *(long *)(*(long *)(in_RDI + 2) + 0x3d8);
        }
        else {
          *(long *)message._32_8_ = in_R8 + *(long *)message._16_8_;
          if (in_RDX <= *(long *)(*(long *)(in_RDI + 2) + 0x3c0)) {
            ffgdesll(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,status_00);
            if (status_00[0x14] < -0x52) {
              local_68 = local_68 << 1;
            }
            else if (status_00[0x14] == -1) {
              local_68 = (local_68 + 7) / 8;
            }
            if (*(long *)message._32_8_ <= local_68) {
              *(long *)message._8_8_ = lVar5 + local_60 + *(long *)(*(long *)(in_RDI + 2) + 0x3d8);
              if (status_00[0x14] < -0x52) {
                ffpdes(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
                       ,(LONGLONG)in_stack_ffffffffffffff30,(LONGLONG)in_stack_ffffffffffffff28,
                       status_00);
              }
              else {
                ffpdes(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
                       ,(LONGLONG)in_stack_ffffffffffffff30,(LONGLONG)in_stack_ffffffffffffff28,
                       status_00);
              }
              return *(int *)message._72_8_;
            }
          }
          if (*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < in_RDX) {
            lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x3c0);
            iVar4 = ffirow(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (LONGLONG)in_stack_ffffffffffffff48,
                           (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            if (0 < iVar4) {
              snprintf(&stack0xffffffffffffff28,0x51,
                       "Failed to add space for %.0f new rows in table.",(double)(in_RDX - lVar1));
              ffpmsg((char *)0x17725f);
              return *(int *)message._72_8_;
            }
          }
          *(long *)message._8_8_ =
               lVar5 + *(long *)(*(long *)(in_RDI + 2) + 0x3d8) +
               *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
          if (status_00[0x14] < -0x52) {
            ffpdes(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                   (LONGLONG)in_stack_ffffffffffffff30,(LONGLONG)in_stack_ffffffffffffff28,status_00
                  );
          }
          else {
            ffpdes(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                   (LONGLONG)in_stack_ffffffffffffff30,(LONGLONG)in_stack_ffffffffffffff28,status_00
                  );
          }
          if ((*(int *)(*(long *)(in_RDI + 2) + 0x38) == 0) &&
             (lVar5 = lVar5 + *(long *)(*(long *)(in_RDI + 2) + 0x3d8) +
                      *(long *)(*(long *)(in_RDI + 2) + 0x3e0) +
                      *(long *)message._32_8_ * *(long *)message._24_8_,
             *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                      (long)(*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1) * 8) < lVar5)) {
            lVar1 = *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                             (long)(*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1) * 8);
            iVar4 = ffiblk(in_stack_00001638,in_stack_00001630,in_stack_0000162c,in_stack_00001620);
            if (0 < iVar4) {
              snprintf(&stack0xffffffffffffff28,0x51,
                       "Failed to extend the size of the variable length heap by %ld blocks.",
                       ((lVar5 + -1) - lVar1) / 0xb40 + 1);
              ffpmsg((char *)0x17748f);
              return *(int *)message._72_8_;
            }
          }
          *(long *)(*(long *)(in_RDI + 2) + 0x3e0) =
               *(long *)message._32_8_ * *(long *)message._24_8_ +
               *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
        }
      }
      else {
        if (*(long *)message._32_8_ <= *(long *)message._16_8_) {
          snprintf(&stack0xffffffffffffff28,0x51,
                   "First element to write is too large: %ld; max allowed value is %ld",
                   *(long *)message._16_8_ + 1,*(undefined8 *)message._32_8_);
          ffpmsg((char *)0x176bcb);
          *(undefined4 *)message._72_8_ = 0x134;
          return 0x134;
        }
        lVar5 = (*(long *)message._16_8_ + in_R8 + -1) / *(long *)message._32_8_ + in_RDX;
        if (local_34 == 0) {
          if ((*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < lVar5) && (!bVar6)) {
            if (*(int *)message._48_8_ == 0) {
              if (*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < in_RDX) {
                snprintf(&stack0xffffffffffffff28,0x51,
                         "Attempted to read from group %ld of the HDU,",in_RDX);
                ffpmsg((char *)0x176e15);
                snprintf(&stack0xffffffffffffff28,0x51,"however the HDU only contains %ld group(s)."
                         ,*(undefined8 *)(*(long *)(in_RDI + 2) + 0x3c0));
                ffpmsg((char *)0x176e4a);
              }
              else {
                ffpmsg((char *)0x176e58);
                snprintf(&stack0xffffffffffffff28,0x51,"  Image has  %ld elements;",
                         *(undefined8 *)message._32_8_);
                ffpmsg((char *)0x176e85);
                snprintf(&stack0xffffffffffffff28,0x51,
                         "  Tried to read %ld elements starting at element %ld.",in_R8,in_RCX);
                ffpmsg((char *)0x176eb7);
              }
            }
            else {
              ffpmsg((char *)0x176ec8);
              snprintf(&stack0xffffffffffffff28,0x51,
                       "  Table has %.0f rows with %.0f elements per row;",
                       (double)*(long *)(*(long *)(in_RDI + 2) + 0x3c0),
                       (double)*(long *)message._32_8_);
              ffpmsg((char *)0x176f0c);
              snprintf(&stack0xffffffffffffff28,0x51,
                       "  Tried to read %.0f elements starting at row %.0f, element %.0f.",
                       (double)in_R8,(double)in_RDX,(double)(*(long *)message._16_8_ + 1));
              ffpmsg((char *)0x176f56);
            }
            *(undefined4 *)message._72_8_ = 0x133;
            return 0x133;
          }
        }
        else if ((*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < lVar5) && (0 < in_R8)) {
          if ((*(int *)(*(long *)(in_RDI + 2) + 0x38) == 0) ||
             (0 < *(long *)(*(long *)(in_RDI + 2) + 0x3e0))) {
            lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x3c0);
            iVar4 = ffirow(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (LONGLONG)in_stack_ffffffffffffff48,
                           (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            if (0 < iVar4) {
              snprintf(&stack0xffffffffffffff28,0x51,
                       "Failed to add space for %.0f new rows in table.",(double)(lVar5 - lVar1));
              ffpmsg((char *)0x176d0b);
              return *(int *)message._72_8_;
            }
          }
          else {
            *(long *)(*(long *)(in_RDI + 2) + 0x3d8) =
                 (lVar5 - *(long *)(*(long *)(in_RDI + 2) + 0x3c0)) *
                 *(long *)(*(long *)(in_RDI + 2) + 0x3c8) + *(long *)(*(long *)(in_RDI + 2) + 0x3d8)
            ;
            *(long *)(*(long *)(in_RDI + 2) + 0x3c0) = lVar5;
          }
        }
        if (((*(long *)message._32_8_ == 1) && (1 < in_R8)) && (local_34 != 2)) {
          *(undefined8 *)message._24_8_ = *(undefined8 *)message._40_8_;
          *(long *)message._32_8_ = in_R8;
        }
      }
      local_4 = *(int *)message._72_8_;
    }
  }
  else {
    snprintf(&stack0xffffffffffffff28,0x51,"Starting element number less than 1: %ld",in_RCX);
    ffpmsg((char *)0x176392);
    *(undefined4 *)message._72_8_ = 0x134;
    local_4 = 0x134;
  }
  return local_4;
}

Assistant:

int ffgcprll( fitsfile *fptr, /* I - FITS file pointer                      */
        int colnum,     /* I - column number (1 = 1st column of table)      */
        LONGLONG firstrow,  /* I - first row (1 = 1st row of table)         */
        LONGLONG firstelem, /* I - first element within vector (1 = 1st)    */
        LONGLONG nelem, /* I - number of elements to read or write          */
        int writemode,  /* I - = 1 if writing data, = 0 if reading data     */
                        /*     If = 2, then writing data, but don't modify  */
                        /*     the returned values of repeat and incre.     */
                        /*     If = -1, then reading data in reverse        */
                        /*     direction.                                   */
	                /*     If writemode has 16 added, then treat        */
	                /*        TSTRING column as TBYTE vector            */
        double *scale,  /* O - FITS scaling factor (TSCALn keyword value)   */
        double *zero,   /* O - FITS scaling zero pt (TZEROn keyword value)  */
        char *tform,    /* O - ASCII column format: value of TFORMn keyword */
        long *twidth,   /* O - width of ASCII column (characters)           */
        int *tcode,     /* O - abs(column datatype code): I*4=41, R*4=42, etc */
        int *maxelem,   /* O - max number of elements that fit in buffer    */
        LONGLONG *startpos,/* O - offset in file to starting row & column      */
        LONGLONG *elemnum, /* O - starting element number ( 0 = 1st element)   */
        long *incre,    /* O - byte offset between elements within a row    */
        LONGLONG *repeat,  /* O - number of elements in a row (vector column)  */
        LONGLONG *rowlen,  /* O - length of a row, in bytes                    */
        int  *hdutype,  /* O - HDU type: 0, 1, 2 = primary, table, bintable */
        LONGLONG *tnull,    /* O - null value for integer columns               */
        char *snull,    /* O - null value for ASCII table columns           */
        int *status)    /* IO - error status                                */
/*
  Get Column PaRameters, and test starting row and element numbers for 
  validity.  This is a workhorse routine that is call by nearly every
  other routine that reads or writes to FITS files.
*/
{
    int nulpos, rangecheck = 1, tstatus = 0;
    LONGLONG datastart, endpos;
    long nblock;
    LONGLONG heapoffset, lrepeat, endrow, nrows, tbcol;
    char message[FLEN_ERRMSG];
    tcolumn *colptr;

    if (fptr->HDUposition != (fptr->Fptr)->curhdu) {
        /* reset position to the correct HDU if necessary */
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    } else if ((fptr->Fptr)->datastart == DATA_UNDEFINED) {
        /* rescan header if data structure is undefined */
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    } else if (writemode > 0 && writemode != 15) {

	/* Only terminate the header with the END card if */
	/* writing to the stdout stream (don't have random access). */

	/* Initialize STREAM_DRIVER to be the device number for */
	/* writing FITS files directly out to the stdout stream. */
	/* This only needs to be done once and is thread safe. */
	if (STREAM_DRIVER <= 0 || STREAM_DRIVER > 40) {
            urltype2driver("stream://", &STREAM_DRIVER);
        }

        if ((fptr->Fptr)->driver == STREAM_DRIVER) {
	    if ((fptr->Fptr)->ENDpos != 
	       maxvalue((fptr->Fptr)->headend , (fptr->Fptr)->datastart -2880)) {
	           ffwend(fptr, status);
	    } 
	}
    }

    /* Do sanity check of input parameters */
    if (firstrow < 1)
    {
        if ((fptr->Fptr)->hdutype == IMAGE_HDU) /*  Primary Array or IMAGE */
        {
          snprintf(message,FLEN_ERRMSG, "Image group number is less than 1: %.0f",
                (double) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
        }
        else
        {
          snprintf(message, FLEN_ERRMSG,"Starting row number is less than 1: %.0f",
                (double) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
        }
    }
    else if ((fptr->Fptr)->hdutype != ASCII_TBL && firstelem < 1)
    {
        snprintf(message, FLEN_ERRMSG,"Starting element number less than 1: %ld",
               (long) firstelem);
        ffpmsg(message);
        return(*status = BAD_ELEM_NUM);
    }
    else if (nelem < 0)
    {
        snprintf(message, FLEN_ERRMSG,"Tried to read or write less than 0 elements: %.0f",
            (double) nelem);
        ffpmsg(message);
        return(*status = NEG_BYTES);
    }
    else if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        snprintf(message, FLEN_ERRMSG,"  There are %d columns in this table.",
                (fptr->Fptr)->tfield );
        ffpmsg(message);

        return(*status = BAD_COL_NUM);
    }

    /*  copy relevant parameters from the structure */

    *hdutype = (fptr->Fptr)->hdutype;    /* image, ASCII table, or BINTABLE  */
    *rowlen   = (fptr->Fptr)->rowlength; /* width of the table, in bytes     */
    datastart = (fptr->Fptr)->datastart; /* offset in file to start of table */

    colptr  = (fptr->Fptr)->tableptr;    /* point to first column */
    colptr += (colnum - 1);      /* offset to correct column structure */

    *scale    = colptr->tscale;  /* value scaling factor;    default = 1.0 */
    *zero     = colptr->tzero;   /* value scaling zeropoint; default = 0.0 */
    *tnull    = colptr->tnull;   /* null value for integer columns         */
    tbcol     = colptr->tbcol;   /* offset to start of column within row   */
    *twidth   = colptr->twidth;  /* width of a single datum, in bytes      */
    *incre    = colptr->twidth;  /* increment between datums, in bytes     */

    *tcode    = colptr->tdatatype;
    *repeat   = colptr->trepeat;

    strcpy(tform, colptr->tform);    /* value of TFORMn keyword            */
    strcpy(snull, colptr->strnull);  /* null value for ASCII table columns */

    if (*hdutype == ASCII_TBL && snull[0] == '\0')
    {
     /* In ASCII tables, a null value is equivalent to all spaces */

       strcpy(snull, "                 ");   /* maximum of 17 spaces */
       nulpos = minvalue(17, *twidth);      /* truncate to width of column */
       snull[nulpos] = '\0';
    }

    /* Special case: use writemode = 15,16,17,18 to interpret TSTRING columns
       as TBYTE vectors instead (but not for ASCII tables). 
          writemode = 15 equivalent to writemode =-1
          writemode = 16 equivalent to writemode = 0
          writemode = 17 equivalent to writemode = 1
          writemode = 18 equivalent to writemode = 2
    */
    if (writemode >= 15 && writemode <= 18) {

      if (abs(*tcode) == TSTRING && *hdutype != ASCII_TBL ) {
        *incre = 1;          /* each element is 1 byte wide */
	if (*tcode < 0) *repeat = *twidth;  /* variable columns appear to put width in *twidth */
        *twidth = 1;         /* width of each element */
        *scale = 1.0;        /* no scaling */
        *zero  = 0.0;
        *tnull = NULL_UNDEFINED;  /* don't test for nulls */
        *maxelem = DBUFFSIZE;

	if (*tcode < 0) {
	  *tcode = -TBYTE; /* variable-length */
	} else {
	  *tcode =  TBYTE;
	}
      }

      /* translate to the equivalent as listed above */
      writemode -= 16;
    }

    /* Special case:  interpret writemode = -1 as reading data, but */
    /* don't do error check for exceeding the range of pixels  */
    if (writemode == -1)
    {
      writemode = 0;
      rangecheck = 0;
    }

    /* Special case: interprete 'X' column as 'B' */
    if (abs(*tcode) == TBIT)
    {
        *tcode  = *tcode / TBIT * TBYTE;
        *repeat = (*repeat + 7) / 8;
    }

    /* Special case: support the 'rAw' format in BINTABLEs */
    if (*hdutype == BINARY_TBL && *tcode == TSTRING) {
       if (*twidth)
          *repeat = *repeat / *twidth;  /* repeat = # of unit strings in field */
       else
          *repeat = 0;
    }
    else if (*hdutype == BINARY_TBL && *tcode == -TSTRING) {
       /* variable length string */
       *incre = 1;
       *twidth = (long) nelem;
    }

    if (*hdutype == ASCII_TBL)
        *elemnum = 0;   /* ASCII tables don't have vector elements */
    else
        *elemnum = firstelem - 1;

    /* interprete complex and double complex as pairs of floats or doubles */
    if (abs(*tcode) >= TCOMPLEX)
    {
        if (*tcode > 0)
          *tcode = (*tcode + 1) / 2;
        else
          *tcode = (*tcode - 1) / 2;

        *repeat  = *repeat * 2;
        *twidth  = *twidth / 2;
        *incre   = *incre  / 2;
    }

    /* calculate no. of pixels that fit in buffer */
    /* allow for case where floats are 8 bytes long */
    if (abs(*tcode) == TFLOAT)
       *maxelem = DBUFFSIZE / sizeof(float);
    else if (abs(*tcode) == TDOUBLE)
       *maxelem = DBUFFSIZE / sizeof(double);
    else if (abs(*tcode) == TSTRING)
    {
       if (*twidth)
          *maxelem = (DBUFFSIZE - 1)/ *twidth; /* leave room for final \0 */
       else
          *maxelem = DBUFFSIZE - 1;
          
       if (*maxelem == 0) {
            snprintf(message,FLEN_ERRMSG,
        "ASCII string column is too wide: %ld; max supported width is %d",
                   *twidth,  DBUFFSIZE - 1);
            ffpmsg(message);
            return(*status = COL_TOO_WIDE);
        }
    }
    else
       *maxelem = DBUFFSIZE / *twidth; 

    /* calc starting byte position to 1st element of col  */
    /*  (this does not apply to variable length columns)  */
    *startpos = datastart + ((LONGLONG)(firstrow - 1) * *rowlen) + tbcol;

    if (*hdutype == IMAGE_HDU && writemode) /*  Primary Array or IMAGE */
    { /*
        For primary arrays, set the repeat count greater than the total
        number of pixels to be written.  This prevents an out-of-range
        error message in cases where the final image array size is not
        yet known or defined.
      */
        if (*repeat < *elemnum + nelem)
            *repeat = *elemnum + nelem; 
    }
    else if (*tcode > 0)     /*  Fixed length table column  */
    {
        if (*elemnum >= *repeat)
        {
            snprintf(message,FLEN_ERRMSG,
        "First element to write is too large: %ld; max allowed value is %ld",
                   (long) ((*elemnum) + 1), (long) *repeat);
            ffpmsg(message);
            return(*status = BAD_ELEM_NUM);
        }

        /* last row number to be read or written */
        endrow = ((*elemnum + nelem - 1) / *repeat) + firstrow;

        if (writemode)
        {
            /* check if we are writing beyond the current end of table */
            if ((endrow > (fptr->Fptr)->numrows) && (nelem > 0) )
            {
                /* if there are more HDUs following the current one, or */
                /* if there is a data heap, then we must insert space */
                /* for the new rows.  */
                if ( !((fptr->Fptr)->lasthdu) || (fptr->Fptr)->heapsize > 0)
                {
                    nrows = endrow - ((fptr->Fptr)->numrows);
                    if (ffirow(fptr, (fptr->Fptr)->numrows, nrows, status) > 0)
                    {
                       snprintf(message,FLEN_ERRMSG,
                       "Failed to add space for %.0f new rows in table.",
                       (double) nrows);
                       ffpmsg(message);
                       return(*status);
                    }
                }
                else
                {
                  /* update heap starting address */
                  (fptr->Fptr)->heapstart += 
                  ((LONGLONG)(endrow - (fptr->Fptr)->numrows) * 
                          (fptr->Fptr)->rowlength );

                  (fptr->Fptr)->numrows = endrow; /* update number of rows */
                }
            }
        }
        else  /* reading from the file */
        {
          if ( endrow > (fptr->Fptr)->numrows && rangecheck)
          {
            if (*hdutype == IMAGE_HDU) /*  Primary Array or IMAGE */
            {
              if (firstrow > (fptr->Fptr)->numrows)
              {
                snprintf(message, FLEN_ERRMSG,
                  "Attempted to read from group %ld of the HDU,", (long) firstrow);
                ffpmsg(message);

                snprintf(message, FLEN_ERRMSG,
                  "however the HDU only contains %ld group(s).",
                   (long) ((fptr->Fptr)->numrows) );
                ffpmsg(message);
              }
              else
              {
                ffpmsg("Attempt to read past end of array:");
                snprintf(message, FLEN_ERRMSG,
                  "  Image has  %ld elements;", (long) *repeat);
                ffpmsg(message);

                snprintf(message, FLEN_ERRMSG, 
                "  Tried to read %ld elements starting at element %ld.",
                (long) nelem, (long) firstelem);
                ffpmsg(message);
              }
            }
            else
            {
              ffpmsg("Attempt to read past end of table:");
              snprintf(message, FLEN_ERRMSG,
                "  Table has %.0f rows with %.0f elements per row;",
                    (double) ((fptr->Fptr)->numrows), (double) *repeat);
              ffpmsg(message);

              snprintf(message, FLEN_ERRMSG,
              "  Tried to read %.0f elements starting at row %.0f, element %.0f.",
              (double) nelem, (double) firstrow, (double) ((*elemnum) + 1));
              ffpmsg(message);

            }
            return(*status = BAD_ROW_NUM);
          }
        }

        if (*repeat == 1 && nelem > 1 && writemode != 2)
        { /*
            When accessing a scalar column, fool the calling routine into
            thinking that this is a vector column with very big elements.
            This allows multiple values (up to the maxelem number of elements
            that will fit in the buffer) to be read or written with a single
            routine call, which increases the efficiency.

            If writemode == 2, then the calling program does not want to
            have this efficiency trick applied.
          */           
            if (*rowlen <= LONG_MAX) {
                *incre = (long) *rowlen;
                *repeat = nelem;
            }
        }
    }
    else    /*  Variable length Binary Table column */
    {
      *tcode *= (-1);  

      if (writemode)    /* return next empty heap address for writing */
      {

        *repeat = nelem + *elemnum; /* total no. of elements in the field */

        /* first, check if we are overwriting an existing row, and */
        /* if so, if the existing space is big enough for the new vector */

        if ( firstrow <= (fptr->Fptr)->numrows )
        {
          ffgdesll(fptr, colnum, firstrow, &lrepeat, &heapoffset, &tstatus);
          if (!tstatus)
          {
            if (colptr->tdatatype <= -TCOMPLEX)
              lrepeat = lrepeat * 2;  /* no. of float or double values */
            else if (colptr->tdatatype == -TBIT)
              lrepeat = (lrepeat + 7) / 8;  /* convert from bits to bytes */

            if (lrepeat >= *repeat)  /* enough existing space? */
            {
              *startpos = datastart + heapoffset + (fptr->Fptr)->heapstart;

              /*  write the descriptor into the fixed length part of table */
              if (colptr->tdatatype <= -TCOMPLEX)
              {
                /* divide repeat count by 2 to get no. of complex values */
                ffpdes(fptr, colnum, firstrow, *repeat / 2, 
                      heapoffset, status);
              }
              else
              {
                ffpdes(fptr, colnum, firstrow, *repeat,
                      heapoffset, status);
              }
              return(*status);
            }
          }
        }

        /* Add more rows to the table, if writing beyond the end. */
        /* It is necessary to shift the heap down in this case */
        if ( firstrow > (fptr->Fptr)->numrows)
        {
            nrows = firstrow - ((fptr->Fptr)->numrows);
            if (ffirow(fptr, (fptr->Fptr)->numrows, nrows, status) > 0)
            {
                snprintf(message,FLEN_ERRMSG,
                "Failed to add space for %.0f new rows in table.",
                       (double) nrows);
                ffpmsg(message);
                return(*status);
            }
        }

        /*  calculate starting position (for writing new data) in the heap */
        *startpos = datastart + (fptr->Fptr)->heapstart + 
                    (fptr->Fptr)->heapsize;

        /*  write the descriptor into the fixed length part of table */
        if (colptr->tdatatype <= -TCOMPLEX)
        {
          /* divide repeat count by 2 to get no. of complex values */
          ffpdes(fptr, colnum, firstrow, *repeat / 2, 
                (fptr->Fptr)->heapsize, status);
        }
        else
        {
          ffpdes(fptr, colnum, firstrow, *repeat, (fptr->Fptr)->heapsize,
                 status);
        }

        /* If this is not the last HDU in the file, then check if */
        /* extending the heap would overwrite the following header. */
        /* If so, then have to insert more blocks. */
        if ( !((fptr->Fptr)->lasthdu) )
        {
            endpos = datastart + (fptr->Fptr)->heapstart + 
                     (fptr->Fptr)->heapsize + ( *repeat * (*incre));

            if (endpos > (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1])
            {
                /* calc the number of blocks that need to be added */
                nblock = (long) (((endpos - 1 - 
                         (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] ) 
                         / 2880) + 1);

                if (ffiblk(fptr, nblock, 1, status) > 0) /* insert blocks */
                {
                  snprintf(message,FLEN_ERRMSG,
       "Failed to extend the size of the variable length heap by %ld blocks.",
                   nblock);
                   ffpmsg(message);
                   return(*status);
                }
            }
        }

        /* increment the address to the next empty heap position */
        (fptr->Fptr)->heapsize += ( *repeat * (*incre)); 
      }
      else    /*  get the read start position in the heap */
      {
        if ( firstrow > (fptr->Fptr)->numrows)
        {
            ffpmsg("Attempt to read past end of table");
            snprintf(message,FLEN_ERRMSG, 
                "  Table has %.0f rows and tried to read row %.0f.",
                (double) ((fptr->Fptr)->numrows), (double) firstrow);
            ffpmsg(message);
            return(*status = BAD_ROW_NUM);
        }

        ffgdesll(fptr, colnum, firstrow, &lrepeat, &heapoffset, status);
        *repeat = lrepeat;

        if (colptr->tdatatype <= -TCOMPLEX)
            *repeat = *repeat * 2;  /* no. of float or double values */
        else if (colptr->tdatatype == -TBIT)
            *repeat = (*repeat + 7) / 8;  /* convert from bits to bytes */

        if (*elemnum >= *repeat)
        {
            snprintf(message,FLEN_ERRMSG, 
         "Starting element to read in variable length column is too large: %ld",
                    (long) firstelem);
            ffpmsg(message);
            snprintf(message,FLEN_ERRMSG, 
         "  This row only contains %ld elements", (long) *repeat);
            ffpmsg(message);
            return(*status = BAD_ELEM_NUM);
        }

        *startpos = datastart + heapoffset + (fptr->Fptr)->heapstart;
      }
    }
    return(*status);
}